

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeAsyncGeneratorPrototype
               (DynamicObject *asyncGeneratorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  code *pcVar1;
  bool bVar2;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  ScriptContext *this_01;
  ScriptConfiguration *pSVar3;
  undefined4 *puVar4;
  DynamicObject **ppDVar5;
  JavascriptString *value;
  JavascriptFunction *pJVar6;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *asyncGeneratorPrototype_local;
  
  this = RecyclableObject::GetLibrary(&asyncGeneratorPrototype->super_RecyclableObject);
  this_00 = GetScriptContext(this);
  this_01 = GetScriptContext(this);
  pSVar3 = ScriptContext::GetConfig(this_01);
  bVar2 = ScriptConfiguration::IsES2018AsyncIterationEnabled(pSVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0xb89,
                                "(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled())"
                                ,
                                "library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  DeferredTypeHandlerBase::Convert(typeHandler,asyncGeneratorPrototype,mode,5,0);
  ppDVar5 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype);
  AddMember(this,asyncGeneratorPrototype,0x67,*ppDVar5,'\x02');
  pSVar3 = ScriptContext::GetConfig(this_00);
  bVar2 = ScriptConfiguration::IsES6ToStringTagEnabled(pSVar3);
  if (bVar2) {
    value = CreateStringFromCppLiteral<15ul>(this,(char16 (*) [15])L"AsyncGenerator");
    AddMember(this,asyncGeneratorPrototype,0x1b,value,'\x02');
  }
  pJVar6 = EnsureAsyncGeneratorReturnFunction(this);
  AddMember(this,asyncGeneratorPrototype,0x135,pJVar6,'\x06');
  pJVar6 = EnsureAsyncGeneratorNextFunction(this);
  AddMember(this,asyncGeneratorPrototype,0x107,pJVar6,'\x06');
  pJVar6 = EnsureAsyncGeneratorThrowFunction(this);
  AddMember(this,asyncGeneratorPrototype,0x16a,pJVar6,'\x06');
  DynamicObject::SetHasNoEnumerableProperties(asyncGeneratorPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncGeneratorPrototype(DynamicObject* asyncGeneratorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = asyncGeneratorPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();
        Assert(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled());
        typeHandler->Convert(asyncGeneratorPrototype, mode, 5);

        library->AddMember(asyncGeneratorPrototype, PropertyIds::constructor, library->asyncGeneratorFunctionPrototype, PropertyConfigurable);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(asyncGeneratorPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("AsyncGenerator")), PropertyConfigurable);
        }

        library->AddMember(asyncGeneratorPrototype, PropertyIds::return_, library->EnsureAsyncGeneratorReturnFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(asyncGeneratorPrototype, PropertyIds::next, library->EnsureAsyncGeneratorNextFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(asyncGeneratorPrototype, PropertyIds::throw_, library->EnsureAsyncGeneratorThrowFunction(), PropertyBuiltInMethodDefaults);

        asyncGeneratorPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }